

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkrequestfactory.cpp
# Opt level: O3

void __thiscall
QNetworkRequestFactory::setBearerToken(QNetworkRequestFactory *this,QByteArray *token)

{
  bool bVar1;
  QNetworkRequestFactoryPrivate *pQVar2;
  
  bVar1 = ::operator==(&((this->d).d.ptr)->bearerToken,token);
  if (bVar1) {
    return;
  }
  pQVar2 = (this->d).d.ptr;
  if ((__atomic_base<int>)
      *(__int_type *)
       &(pQVar2->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value != (__atomic_base<int>)0x1) {
    QExplicitlySharedDataPointer<QNetworkRequestFactoryPrivate>::detach_helper(&this->d);
    pQVar2 = (this->d).d.ptr;
  }
  QByteArray::operator=(&pQVar2->bearerToken,token);
  return;
}

Assistant:

void QNetworkRequestFactory::setBearerToken(const QByteArray &token)
{
    if (d->bearerToken == token)
        return;

    d.detach();
    d->bearerToken = token;
}